

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void av1_init_motion_fpf(search_site_config *cfg,int stride)

{
  FULLPEL_MV FVar1;
  FULLPEL_MV *mv;
  int in_ESI;
  long in_RDI;
  search_site *site;
  int i;
  FULLPEL_MV search_site_mvs [13];
  int num_search_pts;
  int tan_radius;
  int radius;
  int stage_index;
  int num_search_steps;
  int local_6c;
  int local_5c;
  FULLPEL_MV local_58;
  short local_54;
  undefined2 local_52;
  short local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  short local_4a;
  undefined2 local_48;
  short local_46;
  short local_44;
  short local_42;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  short local_38;
  short local_36;
  short local_34;
  short local_32;
  short local_30;
  short local_2e;
  short local_2c;
  short local_2a;
  short local_28;
  short local_26;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_10 = 0;
  local_14 = 10;
  *(undefined2 *)(in_RDI + 0x550) = 0;
  *(undefined2 *)(in_RDI + 0x552) = 0;
  *(undefined4 *)(in_RDI + 0x554) = 0;
  *(int *)(in_RDI + 0xc64) = in_ESI;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_18 = 0x400; 0 < local_18; local_18 = local_18 / 2) {
    if ((int)((double)local_18 * 0.41) < 2) {
      local_6c = 1;
    }
    else {
      local_6c = (int)((double)local_18 * 0.41);
    }
    local_1c = local_6c;
    local_20 = 0xc;
    if (local_18 == 1) {
      local_20 = 8;
    }
    local_58.row = 0;
    local_58.col = 0;
    local_50 = (short)local_18;
    local_54 = -local_50;
    local_52 = 0;
    local_4e = 0;
    local_4c = 0;
    local_4a = -local_50;
    local_48 = 0;
    local_46 = local_50;
    local_44 = -local_50;
    local_3e = (short)local_6c;
    local_42 = -local_3e;
    local_40 = local_50;
    local_3c = -local_3e;
    local_3a = local_50;
    local_38 = local_3e;
    local_36 = -local_50;
    local_34 = -local_50;
    local_32 = local_3e;
    local_30 = local_50;
    local_2e = -local_3e;
    local_2c = local_3e;
    local_2a = local_50;
    local_28 = -local_3e;
    local_26 = -local_50;
    for (local_5c = 0; local_5c <= local_20; local_5c = local_5c + 1) {
      mv = (FULLPEL_MV *)(local_8 + (long)local_14 * 0x88 + (long)local_5c * 8);
      *mv = (&local_58)[local_5c];
      FVar1 = (FULLPEL_MV)get_offset_from_fullmv(mv,local_c);
      mv[1] = FVar1;
    }
    *(int *)(local_8 + 0xbb4 + (long)local_14 * 4) = local_20;
    *(int *)(local_8 + 0xc0c + (long)local_14 * 4) = local_18;
    local_14 = local_14 + -1;
    local_10 = local_10 + 1;
  }
  *(int *)(local_8 + 0xbb0) = local_10;
  return;
}

Assistant:

void av1_init_motion_fpf(search_site_config *cfg, int stride) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  for (int radius = MAX_FIRST_STEP; radius > 0; radius /= 2) {
    // Generate offsets for 8 search sites per step.
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if (radius == 1) num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}